

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

bool cfd::core::Privkey::HasWif(string *wif,NetType *net_type,bool *is_compressed)

{
  int iVar1;
  NetType NVar2;
  size_t sVar3;
  bool bVar4;
  uint32_t prefix;
  size_t is_uncompressed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  ByteData data;
  uint local_74;
  size_t local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ByteData local_50;
  CfdSourceLocation local_38;
  
  local_70 = 0;
  iVar1 = wally_wif_is_uncompressed((wif->_M_dataplus)._M_p,&local_70);
  if (iVar1 == 0) {
    CryptoUtil::DecodeBase58Check(&local_50,(string *)wif);
    sVar3 = ByteData::GetDataSize(&local_50);
    bVar4 = 0x20 < sVar3;
    if (bVar4) {
      ByteData::GetBytes(&local_68,&local_50);
      local_74 = (uint)*local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      if (net_type != (NetType *)0x0) {
        if (local_74 == 0x80) {
          NVar2 = kMainnet;
        }
        else {
          if (*local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != 0xef) {
            local_38.filename = "cfdcore_key.cpp";
            local_38.line = 0x174;
            local_38.funcname = "HasWif";
            logger::log<unsigned_int&>
                      (&local_38,kCfdLogLevelWarning,"Invalid Privkey format. prefix={}",&local_74);
          }
          NVar2 = kTestnet;
        }
        *net_type = NVar2;
      }
      if (is_compressed != (bool *)0x0) {
        *is_compressed = local_70 == 0;
      }
      if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Privkey::HasWif(
    const std::string &wif, NetType *net_type, bool *is_compressed) {
  static constexpr size_t kWifMinimumSize = EC_PRIVATE_KEY_LEN + 1;

  size_t is_uncompressed = 0;
  int ret = wally_wif_is_uncompressed(wif.c_str(), &is_uncompressed);
  if (ret != WALLY_OK) {
    // contains check wif.
    return false;
  }

  bool has_wif = false;
  ByteData data = CryptoUtil::DecodeBase58Check(wif);
  if (data.GetDataSize() >= kWifMinimumSize) {
    std::vector<uint8_t> key_data = data.GetBytes();
    uint32_t prefix = key_data[0];

    if (net_type != nullptr) {
      if (prefix == kPrefixMainnet) {
        *net_type = NetType::kMainnet;
      } else if (prefix == kPrefixTestnet) {
        *net_type = NetType::kTestnet;
      } else {
        warn(CFD_LOG_SOURCE, "Invalid Privkey format. prefix={}", prefix);
        *net_type = NetType::kTestnet;
      }
    }

    if (is_compressed != nullptr) {
      *is_compressed = (is_uncompressed == 0) ? true : false;
    }
    has_wif = true;
  }
  return has_wif;
}